

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [32];
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  __m256i c;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  short sVar12;
  uint uVar13;
  parasail_result_t *ppVar14;
  __m256i *palVar15;
  __m256i *ptr;
  __m256i *b;
  __m256i *__dest;
  __m256i *ptr_00;
  long lVar16;
  int iVar17;
  undefined1 (*pauVar18) [32];
  ulong uVar19;
  uint uVar20;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint a;
  ulong uVar25;
  uint uVar26;
  void *__src;
  undefined4 uVar27;
  uint uVar28;
  short sVar29;
  undefined4 uVar30;
  long lVar31;
  uint uVar32;
  ulong size;
  bool bVar33;
  undefined2 uVar34;
  undefined2 uVar35;
  undefined2 uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar49;
  undefined4 uVar50;
  __m256i *ptr_01;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int iVar51;
  long local_220;
  ulong uVar21;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar2 = (profile->profile16).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_table_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar28 = profile->s1Len;
        uVar19 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_avx2_256_16_cold_1();
        }
        else {
          uVar24 = uVar19 + 0xf;
          iVar51 = ppVar3->min;
          iVar17 = -iVar51;
          if (iVar51 != -open && SBORROW4(iVar51,-open) == iVar51 + open < 0) {
            iVar17 = open;
          }
          sVar12 = 0x7ffe - (short)ppVar3->max;
          a = (uint)uVar24 & 0x7ffffff0;
          ppVar14 = parasail_result_new_table1(a,s2Len);
          if (ppVar14 != (parasail_result_t *)0x0) {
            size = uVar24 >> 4;
            ppVar14->flag = ppVar14->flag | 0x10220404;
            palVar15 = parasail_memalign___m256i(0x20,size);
            ptr = parasail_memalign___m256i(0x20,size);
            b = parasail_memalign___m256i(0x20,size);
            __dest = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            if (ptr_00 != (__m256i *)0x0 &&
                ((__dest != (__m256i *)0x0 && b != (__m256i *)0x0) &&
                (ptr != (__m256i *)0x0 && palVar15 != (__m256i *)0x0))) {
              uVar34 = (undefined2)open;
              uVar35 = (undefined2)gap;
              uVar26 = iVar17 - 0x7fff;
              uVar36 = (undefined2)uVar26;
              uVar13 = uVar26 & 0xffff;
              uVar32 = (uint)size;
              auVar37._0_2_ = (undefined2)-(gap * uVar32);
              auVar37._2_2_ = auVar37._0_2_;
              auVar37._4_2_ = auVar37._0_2_;
              auVar37._6_2_ = auVar37._0_2_;
              auVar37._8_2_ = auVar37._0_2_;
              auVar37._10_2_ = auVar37._0_2_;
              auVar37._12_2_ = auVar37._0_2_;
              auVar37._14_2_ = auVar37._0_2_;
              auVar37._16_2_ = auVar37._0_2_;
              auVar37._18_2_ = auVar37._0_2_;
              auVar37._20_2_ = auVar37._0_2_;
              auVar37._22_2_ = auVar37._0_2_;
              auVar37._24_2_ = auVar37._0_2_;
              auVar37._26_2_ = auVar37._0_2_;
              auVar37._28_2_ = auVar37._0_2_;
              auVar37._30_2_ = auVar37._0_2_;
              auVar37 = vpand_avx2(auVar37,_DAT_00908de0);
              auVar37 = vpaddsw_avx2(ZEXT432(uVar13),auVar37);
              uVar49 = SUB84(b,0);
              uVar50 = (undefined4)((ulong)b >> 0x20);
              alVar9[0]._4_4_ = uVar26;
              alVar9[0]._0_4_ = in_stack_fffffffffffffd68;
              alVar9[1]._0_4_ = uVar49;
              alVar9[1]._4_4_ = uVar50;
              alVar9[2] = (longlong)palVar15;
              alVar9[3]._0_4_ = in_stack_fffffffffffffd80;
              alVar9[3]._4_4_ = in_stack_fffffffffffffd84;
              ptr_01 = palVar15;
              parasail_memset___m256i(b,alVar9,size);
              c[0]._4_4_ = uVar26;
              c[0]._0_4_ = in_stack_fffffffffffffd68;
              c[1]._0_4_ = uVar49;
              c[1]._4_4_ = uVar50;
              c[2] = (longlong)ptr_01;
              c[3]._0_4_ = in_stack_fffffffffffffd80;
              c[3]._4_4_ = in_stack_fffffffffffffd84;
              parasail_memset___m256i(palVar15,c,size);
              auVar7._2_2_ = uVar35;
              auVar7._0_2_ = uVar35;
              auVar7._4_2_ = uVar35;
              auVar7._6_2_ = uVar35;
              auVar7._8_2_ = uVar35;
              auVar7._10_2_ = uVar35;
              auVar7._12_2_ = uVar35;
              auVar7._14_2_ = uVar35;
              auVar7._16_2_ = uVar35;
              auVar7._18_2_ = uVar35;
              auVar7._20_2_ = uVar35;
              auVar7._22_2_ = uVar35;
              auVar7._24_2_ = uVar35;
              auVar7._26_2_ = uVar35;
              auVar7._28_2_ = uVar35;
              auVar7._30_2_ = uVar35;
              auVar47 = ZEXT3264(auVar7);
              auVar1._2_2_ = uVar34;
              auVar1._0_2_ = uVar34;
              auVar1._4_2_ = uVar34;
              auVar1._6_2_ = uVar34;
              auVar1._8_2_ = uVar34;
              auVar1._10_2_ = uVar34;
              auVar1._12_2_ = uVar34;
              auVar1._14_2_ = uVar34;
              auVar1._16_2_ = uVar34;
              auVar1._18_2_ = uVar34;
              auVar1._20_2_ = uVar34;
              auVar1._22_2_ = uVar34;
              auVar1._24_2_ = uVar34;
              auVar1._26_2_ = uVar34;
              auVar1._28_2_ = uVar34;
              auVar1._30_2_ = uVar34;
              auVar46 = ZEXT3264(auVar1);
              alVar9 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar1);
              palVar15 = ptr_00 + (uVar32 - 1);
              uVar21 = size;
              do {
                *palVar15 = alVar9;
                alVar9 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar9,auVar7);
                palVar15 = palVar15 + -1;
                iVar51 = (int)uVar21;
                uVar20 = iVar51 - 1;
                uVar21 = (ulong)uVar20;
              } while (uVar20 != 0 && 0 < iVar51);
              __src = (void *)CONCAT44(uVar50,uVar49);
              pauVar18 = (undefined1 (*) [32])((long)__src + (ulong)(uVar32 - 1) * 0x20);
              uVar21 = (ulong)(uint)s2Len;
              lVar31 = (ulong)(uVar32 + (uVar32 == 0)) << 5;
              lVar16 = size * uVar21;
              auVar6._2_2_ = uVar36;
              auVar6._0_2_ = uVar36;
              auVar6._4_2_ = uVar36;
              auVar6._6_2_ = uVar36;
              auVar6._8_2_ = uVar36;
              auVar6._10_2_ = uVar36;
              auVar6._12_2_ = uVar36;
              auVar6._14_2_ = uVar36;
              auVar6._16_2_ = uVar36;
              auVar6._18_2_ = uVar36;
              auVar6._20_2_ = uVar36;
              auVar6._22_2_ = uVar36;
              auVar6._24_2_ = uVar36;
              auVar6._26_2_ = uVar36;
              auVar6._28_2_ = uVar36;
              auVar6._30_2_ = uVar36;
              auVar48 = ZEXT3264(auVar6);
              auVar8._2_2_ = sVar12;
              auVar8._0_2_ = sVar12;
              auVar8._4_2_ = sVar12;
              auVar8._6_2_ = sVar12;
              auVar8._8_2_ = sVar12;
              auVar8._10_2_ = sVar12;
              auVar8._12_2_ = sVar12;
              auVar8._14_2_ = sVar12;
              auVar8._16_2_ = sVar12;
              auVar8._18_2_ = sVar12;
              auVar8._20_2_ = sVar12;
              auVar8._22_2_ = sVar12;
              auVar8._24_2_ = sVar12;
              auVar8._26_2_ = sVar12;
              auVar8._28_2_ = sVar12;
              auVar8._30_2_ = sVar12;
              local_220 = 0;
              uVar25 = 0;
              iVar51 = 0;
              auVar7 = auVar6;
              do {
                iVar17 = ppVar3->mapper[(byte)s2[uVar25]];
                auVar1 = *pauVar18;
                auVar40 = vperm2i128_avx2(auVar1,auVar1,0x28);
                auVar1 = vpalignr_avx2(auVar1,auVar40,0xe);
                lVar22 = 0;
                auVar40._2_2_ = uVar36;
                auVar40._0_2_ = uVar36;
                auVar40._4_2_ = uVar36;
                auVar40._6_2_ = uVar36;
                auVar40._8_2_ = uVar36;
                auVar40._10_2_ = uVar36;
                auVar40._12_2_ = uVar36;
                auVar40._14_2_ = uVar36;
                auVar40._16_2_ = uVar36;
                auVar40._18_2_ = uVar36;
                auVar40._20_2_ = uVar36;
                auVar40._22_2_ = uVar36;
                auVar40._24_2_ = uVar36;
                auVar40._26_2_ = uVar36;
                auVar40._28_2_ = uVar36;
                auVar40._30_2_ = uVar36;
                auVar42 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar41 = vpaddsw_avx2(auVar1,*(undefined1 (*) [32])
                                                 ((long)pvVar2 + lVar22 + size * (long)iVar17 * 0x20
                                                 ));
                  auVar1 = *(undefined1 (*) [32])((long)__src + lVar22);
                  auVar38 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*ptr_01 + lVar22),
                                         auVar47._0_32_);
                  auVar43 = vpsubsw_avx2(auVar1,auVar46._0_32_);
                  auVar43 = vpmaxsw_avx2(auVar38,auVar43);
                  auVar38 = vpaddsw_avx2(auVar42._0_32_,
                                         *(undefined1 (*) [32])((long)*ptr_00 + lVar22));
                  auVar40 = vpmaxsw_avx2(auVar40,auVar38);
                  auVar41 = vpmaxsw_avx2(auVar43,auVar41);
                  auVar42 = ZEXT3264(auVar41);
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar22) = auVar43;
                  *(undefined1 (*) [32])((long)*ptr + lVar22) = auVar41;
                  lVar22 = lVar22 + 0x20;
                } while (lVar31 != lVar22);
                auVar1 = vperm2i128_avx2(auVar41,auVar41,8);
                auVar41 = vpalignr_avx2(auVar41,auVar1,0xe);
                auVar1 = vpaddsw_avx2(auVar41,(undefined1  [32])*ptr_00);
                auVar1 = vpmaxsw_avx2(auVar40,auVar1);
                iVar17 = 0xe;
                do {
                  auVar40 = vperm2i128_avx2(auVar1,auVar1,0x28);
                  auVar40 = vpalignr_avx2(auVar1,auVar40,0xe);
                  auVar40 = vpaddsw_avx2(auVar37,auVar40);
                  auVar1 = vpmaxsw_avx2(auVar1,auVar40);
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
                auVar40 = vperm2i128_avx2(auVar1,auVar1,0x28);
                auVar1 = vpalignr_avx2(auVar1,auVar40,0xe);
                auVar1 = vpaddsw_avx2(auVar1,ZEXT432(uVar13));
                auVar40 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar41);
                auVar40 = vpmaxsw_avx2(auVar40,auVar1);
                lVar23 = 0;
                lVar22 = local_220;
                do {
                  auVar1 = vpsubsw_avx2(auVar1,auVar47._0_32_);
                  auVar40 = vpsubsw_avx2(auVar40,auVar46._0_32_);
                  auVar1 = vpmaxsw_avx2(auVar1,auVar40);
                  auVar40 = vpmaxsw_avx2(auVar1,*(undefined1 (*) [32])((long)*ptr + lVar23));
                  auVar40 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar40);
                  *(undefined1 (*) [32])((long)__src + lVar23) = auVar40;
                  piVar4 = ((ppVar14->field_4).rowcols)->score_row;
                  auVar39 = auVar40._0_16_;
                  uVar27 = vpextrw_avx(auVar39,0);
                  *(undefined4 *)((long)piVar4 + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,1);
                  uVar30 = vpextrw_avx(auVar39,2);
                  *(undefined4 *)((long)piVar4 + lVar16 * 4 + lVar22) = uVar27;
                  *(undefined4 *)((long)piVar4 + lVar16 * 8 + lVar22) = uVar30;
                  uVar27 = vpextrw_avx(auVar39,3);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0xc + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,4);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x10 + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,5);
                  uVar30 = vpextrw_avx(auVar39,6);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x14 + lVar22) = uVar27;
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x18 + lVar22) = uVar30;
                  uVar27 = vpextrw_avx(auVar39,7);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x1c + lVar22) = uVar27;
                  auVar39 = auVar40._16_16_;
                  uVar27 = vpextrw_avx(auVar39,0);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x20 + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,1);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x24 + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,2);
                  uVar30 = vpextrw_avx(auVar39,3);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x28 + lVar22) = uVar27;
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x2c + lVar22) = uVar30;
                  uVar27 = vpextrw_avx(auVar39,4);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x30 + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,5);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x34 + lVar22) = uVar27;
                  uVar27 = vpextrw_avx(auVar39,6);
                  uVar30 = vpextrw_avx(auVar39,7);
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x38 + lVar22) = uVar27;
                  *(undefined4 *)((long)piVar4 + lVar16 * 0x3c + lVar22) = uVar30;
                  __src = (void *)CONCAT44(uVar50,uVar49);
                  auVar8 = vpminsw_avx2(auVar8,auVar40);
                  auVar6 = vpmaxsw_avx2(auVar6,auVar40);
                  auVar7 = vpmaxsw_avx2(auVar7,auVar40);
                  lVar23 = lVar23 + 0x20;
                  lVar22 = lVar22 + uVar21 * 4;
                } while (lVar31 != lVar23);
                auVar1 = vpcmpgtw_avx2(auVar7,auVar48._0_32_);
                if ((((((((((((((((((((((((((((((((auVar1 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar1 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar1 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar1 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar1 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar1 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar1 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar1 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar1 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar1 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar1 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar1 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar1 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar1 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar1 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar1 >> 0x7f,0) != '\0') ||
                                  (auVar1 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                 || (auVar1 >> 0x8f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar1 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar1 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (auVar1 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (auVar1 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                            || (auVar1 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar1 >> 0xbf,0) != '\0') ||
                          (auVar1 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar1 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar1 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar1 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar1 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar1 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar1 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar1[0x1f] < '\0') {
                  auVar1 = vpermq_avx2(auVar7,0x44);
                  auVar1 = vpmaxsw_avx2(auVar7,auVar1);
                  auVar40 = vpslldq_avx2(auVar1,8);
                  auVar1 = vpmaxsw_avx2(auVar1,auVar40);
                  auVar40 = vpslldq_avx2(auVar1,4);
                  auVar1 = vpmaxsw_avx2(auVar1,auVar40);
                  auVar40 = vpslldq_avx2(auVar1,2);
                  auVar1 = vpmaxsw_avx2(auVar1,auVar40);
                  uVar26 = vpextrw_avx(auVar1._16_16_,7);
                  auVar1 = vpshufhw_avx2(auVar1,0xff);
                  auVar41._8_4_ = 6;
                  auVar41._0_8_ = 0x600000006;
                  auVar41._12_4_ = 6;
                  auVar41._16_4_ = 6;
                  auVar41._20_4_ = 6;
                  auVar41._24_4_ = 6;
                  auVar41._28_4_ = 6;
                  auVar1 = vpermd_avx2(auVar41,auVar1);
                  memcpy(__dest,__src,size << 5);
                  auVar48 = ZEXT3264(auVar1);
                  auVar47 = ZEXT3264(CONCAT230(uVar35,CONCAT228(uVar35,CONCAT226(uVar35,CONCAT224(
                                                  uVar35,CONCAT222(uVar35,CONCAT220(uVar35,CONCAT218
                                                  (uVar35,CONCAT216(uVar35,CONCAT214(uVar35,
                                                  CONCAT212(uVar35,CONCAT210(uVar35,CONCAT28(uVar35,
                                                  CONCAT26(uVar35,CONCAT24(uVar35,CONCAT22(uVar35,
                                                  uVar35))))))))))))))));
                  auVar46 = ZEXT3264(CONCAT230(uVar34,CONCAT228(uVar34,CONCAT226(uVar34,CONCAT224(
                                                  uVar34,CONCAT222(uVar34,CONCAT220(uVar34,CONCAT218
                                                  (uVar34,CONCAT216(uVar34,CONCAT214(uVar34,
                                                  CONCAT212(uVar34,CONCAT210(uVar34,CONCAT28(uVar34,
                                                  CONCAT26(uVar34,CONCAT24(uVar34,CONCAT22(uVar34,
                                                  uVar34))))))))))))))));
                  __src = (void *)CONCAT44(uVar50,uVar49);
                  iVar51 = (int)uVar25;
                }
                uVar25 = uVar25 + 1;
                local_220 = local_220 + 4;
              } while (uVar25 != uVar21);
              bVar33 = (uVar24 & 0x7ffffff0) == 0;
              sVar29 = (short)uVar26;
              if (!bVar33) {
                if (bVar33) {
                  uVar24 = 0;
                  do {
                    if ((*(short *)((long)*__dest + uVar24 * 2) == sVar29) &&
                       (uVar28 = ((uint)uVar24 & 0xf) * uVar32 | (uint)(uVar24 >> 4) & 0xfffffff,
                       (int)uVar28 < (int)uVar19)) {
                      uVar19 = (ulong)uVar28;
                    }
                    uVar28 = (uint)uVar19;
                    uVar24 = uVar24 + 1;
                  } while ((uVar32 & 0x7ffffff) << 4 != (int)uVar24);
                }
                else {
                  auVar38._4_4_ = uVar28;
                  auVar38._0_4_ = uVar28;
                  auVar38._8_4_ = uVar28;
                  auVar38._12_4_ = uVar28;
                  auVar38._16_4_ = uVar28;
                  auVar38._20_4_ = uVar28;
                  auVar38._24_4_ = uVar28;
                  auVar38._28_4_ = uVar28;
                  auVar39._2_2_ = sVar29;
                  auVar39._0_2_ = sVar29;
                  auVar39._4_2_ = sVar29;
                  auVar39._6_2_ = sVar29;
                  auVar39._8_2_ = sVar29;
                  auVar39._10_2_ = sVar29;
                  auVar39._12_2_ = sVar29;
                  auVar39._14_2_ = sVar29;
                  auVar43._4_4_ = uVar32;
                  auVar43._0_4_ = uVar32;
                  auVar43._8_4_ = uVar32;
                  auVar43._12_4_ = uVar32;
                  auVar43._16_4_ = uVar32;
                  auVar43._20_4_ = uVar32;
                  auVar43._24_4_ = uVar32;
                  auVar43._28_4_ = uVar32;
                  auVar37 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                  uVar19 = 0;
                  auVar44._8_4_ = 0xf;
                  auVar44._0_8_ = 0xf0000000f;
                  auVar44._12_4_ = 0xf;
                  auVar44._16_4_ = 0xf;
                  auVar44._20_4_ = 0xf;
                  auVar44._24_4_ = 0xf;
                  auVar44._28_4_ = 0xf;
                  auVar45._8_4_ = 8;
                  auVar45._0_8_ = 0x800000008;
                  auVar45._12_4_ = 8;
                  auVar45._16_4_ = 8;
                  auVar45._20_4_ = 8;
                  auVar45._24_4_ = 8;
                  auVar45._28_4_ = 8;
                  do {
                    auVar5 = vpcmpeqw_avx(auVar39,*(undefined1 (*) [16])((long)*__dest + uVar19 * 2)
                                         );
                    auVar1 = vpmovsxwd_avx2(auVar5);
                    auVar40 = vpsrld_avx2(auVar37,4);
                    auVar7 = vpand_avx2(auVar37,auVar44);
                    auVar7 = vpmulld_avx2(auVar7,auVar43);
                    auVar7 = vpaddd_avx2(auVar7,auVar40);
                    auVar7 = vpminsd_avx2(auVar7,auVar38);
                    auVar38 = vblendvps_avx(auVar38,auVar7,auVar1);
                    uVar19 = uVar19 + 8;
                    auVar37 = vpaddd_avx2(auVar37,auVar45);
                  } while (a != uVar19);
                  auVar39 = vpminsd_avx(auVar38._0_16_,auVar38._16_16_);
                  auVar5 = vpshufd_avx(auVar39,0xee);
                  auVar39 = vpminsd_avx(auVar39,auVar5);
                  auVar5 = vpshufd_avx(auVar39,0x55);
                  auVar39 = vpminsd_avx(auVar39,auVar5);
                  uVar28 = auVar39._0_4_;
                }
              }
              auVar10._2_2_ = uVar36;
              auVar10._0_2_ = uVar36;
              auVar10._4_2_ = uVar36;
              auVar10._6_2_ = uVar36;
              auVar10._8_2_ = uVar36;
              auVar10._10_2_ = uVar36;
              auVar10._12_2_ = uVar36;
              auVar10._14_2_ = uVar36;
              auVar10._16_2_ = uVar36;
              auVar10._18_2_ = uVar36;
              auVar10._20_2_ = uVar36;
              auVar10._22_2_ = uVar36;
              auVar10._24_2_ = uVar36;
              auVar10._26_2_ = uVar36;
              auVar10._28_2_ = uVar36;
              auVar10._30_2_ = uVar36;
              auVar37 = vpcmpgtw_avx2(auVar10,auVar8);
              auVar11._2_2_ = sVar12;
              auVar11._0_2_ = sVar12;
              auVar11._4_2_ = sVar12;
              auVar11._6_2_ = sVar12;
              auVar11._8_2_ = sVar12;
              auVar11._10_2_ = sVar12;
              auVar11._12_2_ = sVar12;
              auVar11._14_2_ = sVar12;
              auVar11._16_2_ = sVar12;
              auVar11._18_2_ = sVar12;
              auVar11._20_2_ = sVar12;
              auVar11._22_2_ = sVar12;
              auVar11._24_2_ = sVar12;
              auVar11._26_2_ = sVar12;
              auVar11._28_2_ = sVar12;
              auVar11._30_2_ = sVar12;
              auVar7 = vpcmpgtw_avx2(auVar6,auVar11);
              auVar37 = vpor_avx2(auVar7,auVar37);
              if ((((((((((((((((((((((((((((((((auVar37 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar37 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar37 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar37 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar37 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar37 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar37 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar37 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar37 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar37 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar37 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar37 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar37 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar37 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar37 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar37 >> 0x7f,0) != '\0') ||
                                (auVar37 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar37 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar37 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar37 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar37 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar37 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar37 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar37 >> 0xbf,0) != '\0') ||
                        (auVar37 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar37 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar37 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar37 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar37 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar37 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar37[0x1f] < '\0') {
                *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                sVar29 = 0;
                iVar51 = 0;
                uVar28 = 0;
              }
              ppVar14->score = (int)sVar29;
              ppVar14->end_query = uVar28;
              ppVar14->end_ref = iVar51;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free((void *)CONCAT44(uVar50,uVar49));
              parasail_free(ptr);
              parasail_free(ptr_01);
              return ppVar14;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        vH = _mm256_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            vH = _mm256_max_epi16(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}